

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O1

void mmt_buf_check_sanity(mmt_buf *buf)

{
  byte bVar1;
  uchar uVar2;
  uint32_t uVar3;
  _func_void_mmt_dup_syscall_ptr_void_ptr *p_Var4;
  _func_void_uint8_t_ptr_uint_void_ptr *p_Var5;
  _func_void_mmt_mmap2_ptr_void_ptr *p_Var6;
  _func_void_mmt_mremap_ptr_void_ptr *p_Var7;
  _func_void_mmt_mmap_ptr_void_ptr *p_Var8;
  _func_void_mmt_unmap_ptr_void_ptr *p_Var9;
  _func_void_mmt_sync_ptr_void_ptr *p_Var10;
  uint uVar11;
  byte *pbVar12;
  mmt_dup_syscall *pmVar13;
  mmt_ioctl_post_v2 *pmVar14;
  mmt_ioctl_post_v2 *pmVar15;
  _func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *p_Var16;
  void *pvVar17;
  mmt_open *pmVar18;
  mmt_mmap2 *pmVar19;
  mmt_mremap *pmVar20;
  mmt_mmap *pmVar21;
  mmt_unmap *pmVar22;
  _func_void_mmt_open_ptr_void_ptr *p_Var23;
  mmt_sync *pmVar24;
  char *pcVar25;
  mmt_buf *buf_00;
  void *pvVar26;
  undefined8 *extraout_RDX;
  int iVar27;
  uint uVar28;
  long lVar29;
  mmt_buf **ppmVar30;
  void *in_RSI;
  uint *puVar31;
  uint *puVar32;
  uint uVar33;
  mmt_memory_dump_v2_prefix *pmStack_230;
  mmt_buf *pmStack_228;
  mmt_memory_dump amStack_220 [20];
  
  if (buf->len < 0x10000) {
    return;
  }
  mmt_buf_check_sanity_cold_1();
  puVar31 = (uint *)0x0;
  pbVar12 = (byte *)mmt_load_data_with_prefix(1,0,1);
  if (pbVar12 != (byte *)0x0) {
    do {
      bVar1 = *pbVar12;
      puVar32 = puVar31;
      if (bVar1 < 0x53) {
        if (bVar1 < 0x4d) {
          if ((bVar1 != 0x2d) && (bVar1 != 0x3d)) goto switchD_002512d8_caseD_66;
          uVar28 = 1;
          do {
            uVar2 = mmt_buf[(uVar28 + mmt_idx) - 1];
            if (uVar2 == '\n') {
              p_Var5 = (((mmt_nvidia_decode_funcs *)buf)->base).msg;
              if (p_Var5 != (_func_void_uint8_t_ptr_uint_void_ptr *)0x0) {
                (*p_Var5)(mmt_buf + mmt_idx,uVar28 - 1,in_RSI);
              }
              mmt_idx = mmt_idx + uVar28;
              break;
            }
            pvVar17 = mmt_load_data_with_prefix(uVar28,0,0);
            uVar28 = uVar28 + 1;
          } while (pvVar17 != (void *)0x0);
          if (uVar2 != '\n') {
            return;
          }
        }
        else {
          if (bVar1 != 0x4d) {
            if (bVar1 != 0x52) goto switchD_002512d8_caseD_66;
            pvVar17 = mmt_load_data_with_prefix(0xb,0,0);
            uVar28 = *(byte *)((long)pvVar17 + 9) + 0xb;
            pmVar18 = (mmt_open *)mmt_load_data_with_prefix(uVar28,0,0);
            mmt_check_eor(uVar28);
            p_Var23 = (_func_void_mmt_open_ptr_void_ptr *)
                      (((mmt_nvidia_decode_funcs *)buf)->base).memread2;
            goto LAB_00251758;
          }
          pmVar19 = (mmt_mmap2 *)mmt_load_data_with_prefix(0x2a,0,0);
          mmt_check_eor(0x2a);
          p_Var6 = (((mmt_nvidia_decode_funcs *)buf)->base).mmap2;
          if (p_Var6 != (_func_void_mmt_mmap2_ptr_void_ptr *)0x0) {
            (*p_Var6)(pmVar19,in_RSI);
          }
          mmt_idx = mmt_idx + 0x2a;
        }
        goto LAB_00251772;
      }
      puVar32 = &switchD_002512d8::switchdataD_00274404;
      switch(bVar1) {
      case 100:
        pmVar13 = (mmt_dup_syscall *)mmt_load_data_with_prefix(10,0,0);
        mmt_check_eor(10);
        p_Var4 = (((mmt_nvidia_decode_funcs *)buf)->base).dup_syscall;
        if (p_Var4 != (_func_void_mmt_dup_syscall_ptr_void_ptr *)0x0) {
          (*p_Var4)(pmVar13,in_RSI);
        }
        mmt_idx = mmt_idx + 10;
        break;
      case 0x65:
        pmVar20 = (mmt_mremap *)mmt_load_data_with_prefix(0x3e,0,0);
        mmt_check_eor(0x3e);
        p_Var7 = (((mmt_nvidia_decode_funcs *)buf)->base).mremap;
        if (p_Var7 != (_func_void_mmt_mremap_ptr_void_ptr *)0x0) {
          (*p_Var7)(pmVar20,in_RSI);
        }
        mmt_idx = mmt_idx + 0x3e;
        break;
      case 0x66:
      case 0x67:
      case 0x68:
      case 0x6b:
      case 0x6c:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x76:
switchD_002512d8_caseD_66:
        mmt_decode_cold_1();
        puVar32[0] = 0;
        puVar32[1] = 0;
        *extraout_RDX = 0;
        uVar28 = (uint)pbVar12;
        pcVar25 = (char *)mmt_load_data_with_prefix(1,uVar28,1);
        if ((pcVar25 != (char *)0x0) && (*pcVar25 == 'y')) {
          pvVar17 = mmt_load_data_with_prefix(9,uVar28,0);
          buf_00 = (mmt_buf *)mmt_load_data_with_prefix(4,uVar28 + 9,0);
          mmt_buf_check_sanity(buf_00);
          uVar3 = buf_00->len;
          pvVar26 = mmt_load_data_with_prefix(uVar3 + 5,uVar28 + 9,0);
          mmt_check_eor(uVar28 + uVar3 + 0xe);
          *(void **)puVar32 = pvVar17;
          *extraout_RDX = pvVar26;
        }
        return;
      case 0x69:
        do {
          pvVar17 = mmt_load_data_with_prefix(0xe,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar17 + 9));
          uVar33 = *(int *)((long)pvVar17 + 9) + 0xe;
          pmVar14 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar33,0,0);
          mmt_check_eor(uVar33);
          ppmVar30 = &amStack_220[0].data;
          lVar29 = 0;
          uVar28 = uVar33;
          do {
            uVar11 = load_memory_dump_v2(uVar28,&pmStack_230,&pmStack_228);
            if (uVar11 == 0) goto LAB_0025139c;
            ((mmt_memory_dump *)(ppmVar30 + -2))->addr = pmStack_230->addr;
            *ppmVar30 = pmStack_228;
            ppmVar30[-1] = (mmt_buf *)0x0;
            lVar29 = lVar29 + 1;
            uVar28 = uVar28 + uVar11;
            ppmVar30 = ppmVar30 + 3;
          } while (lVar29 != 0x14);
          lVar29 = 0x14;
LAB_0025139c:
          iVar27 = (int)lVar29;
          pmVar15 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar33,0,0);
        } while (pmVar14 != pmVar15);
        p_Var16 = (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).ioctl_pre;
        goto LAB_00251467;
      case 0x6a:
        do {
          pvVar17 = mmt_load_data_with_prefix(0x1e,0,0);
          mmt_buf_check_sanity((mmt_buf *)((long)pvVar17 + 0x19));
          uVar33 = *(int *)((long)pvVar17 + 0x19) + 0x1e;
          pmVar14 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar33,0,0);
          mmt_check_eor(uVar33);
          ppmVar30 = &amStack_220[0].data;
          lVar29 = 0;
          uVar28 = uVar33;
          do {
            uVar11 = load_memory_dump_v2(uVar28,&pmStack_230,&pmStack_228);
            if (uVar11 == 0) goto LAB_00251449;
            ((mmt_memory_dump *)(ppmVar30 + -2))->addr = pmStack_230->addr;
            *ppmVar30 = pmStack_228;
            ppmVar30[-1] = (mmt_buf *)0x0;
            lVar29 = lVar29 + 1;
            uVar28 = uVar28 + uVar11;
            ppmVar30 = ppmVar30 + 3;
          } while (lVar29 != 0x14);
          lVar29 = 0x14;
LAB_00251449:
          iVar27 = (int)lVar29;
          pmVar15 = (mmt_ioctl_post_v2 *)mmt_load_data_with_prefix(uVar33,0,0);
        } while (pmVar14 != pmVar15);
        p_Var16 = (((mmt_nvidia_decode_funcs *)buf)->base).ioctl_post;
LAB_00251467:
        if (p_Var16 != (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)0x0) {
          (*p_Var16)(pmVar14,in_RSI,amStack_220,iVar27);
        }
        mmt_idx = mmt_idx + uVar28;
        break;
      case 0x6d:
        pmVar21 = (mmt_mmap *)mmt_load_data_with_prefix(0x1e,0,0);
        mmt_check_eor(0x1e);
        p_Var8 = (((mmt_nvidia_decode_funcs *)buf)->base).mmap;
        if (p_Var8 != (_func_void_mmt_mmap_ptr_void_ptr *)0x0) {
          (*p_Var8)(pmVar21,in_RSI);
        }
        mmt_idx = mmt_idx + 0x1e;
        break;
      case 0x6e:
        mmt_decode_nvidia((mmt_nvidia_decode_funcs *)buf,in_RSI);
        break;
      case 0x6f:
        pvVar17 = mmt_load_data_with_prefix(0x12,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar17 + 0xd));
        uVar28 = *(int *)((long)pvVar17 + 0xd) + 0x12;
        pmVar18 = (mmt_open *)mmt_load_data_with_prefix(uVar28,0,0);
        mmt_check_eor(uVar28);
        p_Var23 = (((mmt_nvidia_decode_funcs *)buf)->base).open;
        goto LAB_00251758;
      case 0x72:
        pvVar17 = mmt_load_data_with_prefix(0xb,0,0);
        uVar28 = *(byte *)((long)pvVar17 + 9) + 0xb;
        pmVar18 = (mmt_open *)mmt_load_data_with_prefix(uVar28,0,0);
        mmt_check_eor(uVar28);
        p_Var23 = (_func_void_mmt_open_ptr_void_ptr *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).memread;
        goto LAB_00251758;
      case 0x74:
        pvVar17 = mmt_load_data_with_prefix(10,0,0);
        mmt_buf_check_sanity((mmt_buf *)((long)pvVar17 + 5));
        uVar28 = *(int *)((long)pvVar17 + 5) + 10;
        pmVar18 = (mmt_open *)mmt_load_data_with_prefix(uVar28,0,0);
        mmt_check_eor(uVar28);
        p_Var23 = (_func_void_mmt_open_ptr_void_ptr *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).write_syscall;
        goto LAB_00251758;
      case 0x75:
        pmVar22 = (mmt_unmap *)mmt_load_data_with_prefix(0x2e,0,0);
        mmt_check_eor(0x2e);
        p_Var9 = (((mmt_nvidia_decode_funcs *)buf)->base).munmap;
        if (p_Var9 != (_func_void_mmt_unmap_ptr_void_ptr *)0x0) {
          (*p_Var9)(pmVar22,in_RSI);
        }
        mmt_idx = mmt_idx + 0x2e;
        break;
      case 0x77:
        pvVar17 = mmt_load_data_with_prefix(0xb,0,0);
        uVar28 = *(byte *)((long)pvVar17 + 9) + 0xb;
        pmVar18 = (mmt_open *)mmt_load_data_with_prefix(uVar28,0,0);
        mmt_check_eor(uVar28);
        p_Var23 = (_func_void_mmt_open_ptr_void_ptr *)
                  (((mmt_nvidia_decode_funcs *)buf)->base).memwrite;
LAB_00251758:
        if (p_Var23 != (_func_void_mmt_open_ptr_void_ptr *)0x0) {
          (*p_Var23)(pmVar18,in_RSI);
        }
        mmt_idx = mmt_idx + uVar28;
        break;
      default:
        if (bVar1 != 0x53) {
          puVar32 = puVar31;
          if (bVar1 != 0x57) goto switchD_002512d8_caseD_66;
          pvVar17 = mmt_load_data_with_prefix(0xb,0,0);
          uVar28 = *(byte *)((long)pvVar17 + 9) + 0xb;
          pmVar18 = (mmt_open *)mmt_load_data_with_prefix(uVar28,0,0);
          mmt_check_eor(uVar28);
          p_Var23 = (_func_void_mmt_open_ptr_void_ptr *)
                    (((mmt_nvidia_decode_funcs *)buf)->base).memwrite2;
          goto LAB_00251758;
        }
        pmVar24 = (mmt_sync *)mmt_load_data_with_prefix(6,0,0);
        mmt_check_eor(6);
        p_Var10 = (((mmt_nvidia_decode_funcs *)buf)->base).sync;
        if (p_Var10 != (_func_void_mmt_sync_ptr_void_ptr *)0x0) {
          (*p_Var10)(pmVar24,in_RSI);
        }
        mmt_idx = mmt_idx + 6;
      }
LAB_00251772:
      puVar31 = (uint *)0x0;
      pbVar12 = (byte *)mmt_load_data_with_prefix(1,0,1);
    } while (pbVar12 != (byte *)0x0);
  }
  return;
}

Assistant:

void mmt_buf_check_sanity(struct mmt_buf *buf)
{
	if (buf->len < MMT_BUF_SIZE)
		return;

	fflush(stdout);
	fprintf(stderr, "buffer too long: %u\n", buf->len);
	fflush(stderr);
	exit(1);
}